

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwGetWindowContentScale(GLFWwindow *handle,float *xscale,float *yscale)

{
  _GLFWwindow *window;
  float *yscale_local;
  float *xscale_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (xscale != (float *)0x0) {
      *xscale = 0.0;
    }
    if (yscale != (float *)0x0) {
      *yscale = 0.0;
    }
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      _glfwPlatformGetWindowContentScale((_GLFWwindow *)handle,xscale,yscale);
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/window.c"
                ,0x2a5,"void glfwGetWindowContentScale(GLFWwindow *, float *, float *)");
}

Assistant:

GLFWAPI void glfwGetWindowContentScale(GLFWwindow* handle,
                                       float* xscale, float* yscale)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xscale)
        *xscale = 0.f;
    if (yscale)
        *yscale = 0.f;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowContentScale(window, xscale, yscale);
}